

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O3

int __thiscall ncnn::Crop_x86::forward(Crop_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *__ptr;
  Allocator *pAVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined8 uVar13;
  int iVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  size_t sVar27;
  int iVar28;
  uint uVar29;
  Option *pOVar30;
  long lVar31;
  bool bVar32;
  int _outw;
  Mat local_158;
  int _outh;
  int _woffset;
  size_t local_108;
  int _outc;
  int _outd;
  int _hoffset;
  Option *local_f0;
  int local_e8;
  uint uStack_e4;
  uint uStack_e0;
  int iStack_dc;
  int _coffset;
  ulong local_d0;
  Mat m;
  int _doffset;
  Mat m_1;
  undefined4 uVar7;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined3 uVar16;
  undefined1 uVar17;
  undefined2 uVar18;
  undefined1 uVar19;
  
  local_158.c = bottom_blob->c;
  uVar22 = (ulong)(uint)local_158.c;
  iVar24 = bottom_blob->dims;
  uVar26 = bottom_blob->w;
  uVar23 = bottom_blob->h;
  iVar28 = bottom_blob->d;
  sVar27 = bottom_blob->elemsize;
  iVar20 = bottom_blob->elempack;
  local_158.elempack = iVar20;
  if (iVar20 != 4) goto LAB_001d0a03;
  uVar29 = iVar24 - 1;
  local_158.w = uVar26;
  local_158.h = uVar23;
  switch(uVar29) {
  case 0:
    local_158.w = uVar26 << 2;
    local_158.dims = 1;
    local_158.h = 1;
    local_158.c = 1;
    local_158.cstep = (size_t)local_158.w;
    break;
  case 1:
    local_158.h = uVar23 << 2;
    local_158.dims = 2;
    local_158.c = 1;
    local_158.cstep = (long)local_158.h * (long)(int)uVar26;
    break;
  case 2:
    local_158.c = local_158.c * 4;
    local_158.dims = 3;
    local_158.cstep = (long)(int)uVar23 * (long)(int)uVar26 + 3U & 0x3ffffffffffffffc;
    break;
  case 3:
    local_158.c = local_158.c * 4;
    local_158.elemsize = 4;
    local_158.elempack = 1;
    local_158.dims = 4;
    local_158.cstep = (long)iVar28 * (long)(int)uVar23 * (long)(int)uVar26 + 3U & 0x3ffffffffffffffc
    ;
    local_158.d = iVar28;
    goto LAB_001d04f3;
  default:
    local_158.cstep = 0;
    local_158.elemsize = 0;
    local_158.elempack = 0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    goto LAB_001d04f3;
  }
  local_158.d = 1;
  local_158.elempack = 1;
  local_158.elemsize = 4;
LAB_001d04f3:
  local_158.allocator = (Allocator *)0x0;
  local_158.refcount._4_4_ = 0;
  local_158.refcount._0_4_ = 0;
  local_158.data = (void *)0x0;
  local_108 = sVar27;
  local_f0 = opt;
  local_e8 = iVar24;
  uStack_e4 = uVar26;
  uStack_e0 = uVar23;
  iStack_dc = iVar28;
  local_d0 = uVar22;
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),&local_158,
             &_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  pOVar30 = local_f0;
  if (3 < uVar29) goto LAB_001d09ec;
  iVar24 = _coffset >> 2;
  uVar26 = _outc >> 2;
  switch(uVar29) {
  case 0:
    uVar26 = _outw & 3;
    iVar24 = (uint)(uVar26 == 0) * 3 + 1;
    uVar22 = (long)_outw % (long)iVar24;
    if (uStack_e4 == _outw / iVar24 && uVar26 == 0) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 == (int *)0x0) goto LAB_001d0f8d;
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 != 0) goto LAB_001d0f8d;
      __ptr = top_blob->data;
      pAVar1 = top_blob->allocator;
joined_r0x001d07b5:
      if (pAVar1 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (*pAVar1->_vptr_Allocator[3])(pAVar1,__ptr,uVar22 & 0xffffffff);
      }
LAB_001d0f8d:
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar20 = bottom_blob->w;
      iVar24 = bottom_blob->h;
      iVar28 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar20;
      top_blob->h = iVar24;
      top_blob->d = iVar28;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 3U) == 0) {
      Mat::create(top_blob,_outw / iVar24,(local_108 >> 2) << (uVar26 == 0) * '\x02',iVar24,
                  local_f0->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar20 = _woffset + 3;
      if (-1 < _woffset) {
        iVar20 = _woffset;
      }
      crop_pack4_sse(bottom_blob,top_blob,0,iVar20 >> 2);
      return 0;
    }
    break;
  case 1:
    if (_outw == uStack_e4) {
      iVar24 = (uint)((_outh & 3U) == 0) * 3 + 1;
      uVar22 = (long)_outh % (long)iVar24;
      if (((_outh & 3U) == 0) && (_outh / iVar24 == uStack_e0)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar2 = bottom_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 == (int *)0x0) goto LAB_001d0f8d;
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 != 0) goto LAB_001d0f8d;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x001d07b5;
      }
    }
    if (((_hoffset | _outh) & 3U) == 0) {
      Mat::create(top_blob,_outw,_outh >> 2,(local_108 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                  local_f0->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar20 = _hoffset + 3;
      if (-1 < _hoffset) {
        iVar20 = _hoffset;
      }
      crop_pack4_sse(bottom_blob,top_blob,iVar20 >> 2,_woffset);
      return 0;
    }
    break;
  case 2:
    sVar27 = (local_108 >> 2) << ((_outc & 3U) == 0) * '\x02';
    uVar23 = uStack_e0 ^ _outh | uStack_e4 ^ _outw;
    bVar32 = uVar23 == 0;
    if (bVar32) {
      iVar28 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar22 = (long)_outc % (long)iVar28;
      if (((_outc & 3U) == 0) && (_outc / iVar28 == (int)local_d0)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar2 = bottom_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 == (int *)0x0) goto LAB_001d0f8d;
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 != 0) goto LAB_001d0f8d;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x001d07b5;
      }
    }
    local_108 = sVar27;
    if (((_coffset | _outc) & 3U) != 0) break;
    local_158.w = bottom_blob->w;
    local_158.h = bottom_blob->h;
    if (bottom_blob->dims == 3) {
      local_158.elemsize = bottom_blob->elemsize;
      local_158.data =
           (void *)((long)iVar24 * bottom_blob->cstep * local_158.elemsize + (long)bottom_blob->data
                   );
      lVar21 = (long)local_158.h * (long)local_158.w * local_158.elemsize;
      local_158.d = 1;
      local_158.dims = 3;
    }
    else {
      local_158.d = bottom_blob->d;
      local_158.elemsize = bottom_blob->elemsize;
      local_158.data =
           (void *)((long)iVar24 * bottom_blob->cstep * local_158.elemsize + (long)bottom_blob->data
                   );
      lVar21 = (long)local_158.h * (long)local_158.w * (long)local_158.d * local_158.elemsize;
      local_158.dims = 4;
    }
    local_158.allocator = bottom_blob->allocator;
    local_158.elempack = bottom_blob->elempack;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.cstep = (lVar21 + 0xfU & 0xfffffffffffffff0) / local_158.elemsize;
    local_158.c = uVar26;
    if (bVar32) {
      Mat::clone(&m,(__fn *)&local_158,(void *)0x0,CONCAT31((int3)(uVar23 >> 8),bVar32),
                 (void *)(ulong)(uint)_outh);
      if (&m != top_blob) {
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = m.data;
        top_blob->refcount = m.refcount;
        top_blob->elemsize = m.elemsize;
        top_blob->elempack = m.elempack;
        top_blob->allocator = m.allocator;
        top_blob->dims = m.dims;
        top_blob->w = m.w;
        top_blob->h = m.h;
        top_blob->d = m.d;
        top_blob->c = m.c;
        top_blob->cstep = m.cstep;
      }
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar20 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
      goto LAB_001d10d8;
    }
    else {
LAB_001d10d8:
      iVar20 = _outc + 3;
      if (-1 < _outc) {
        iVar20 = _outc;
      }
      Mat::create(top_blob,_outw,_outh,iVar20 >> 2,sVar27,4,pOVar30->blob_allocator);
      iVar20 = -100;
      if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
        if (top_blob->c < 1) {
          iVar20 = 0;
        }
        else {
          lVar21 = 0;
          do {
            m.c = 1;
            if (local_158.dims != 3) {
              m.c = local_158.d;
            }
            m.data = (void *)(local_158.cstep * lVar21 * local_158.elemsize + (long)local_158.data);
            iVar20 = 0;
            m.refcount = (int *)0x0;
            m.elemsize = local_158.elemsize;
            m.elempack = local_158.elempack;
            m.allocator = local_158.allocator;
            m._40_8_ = CONCAT44(local_158.w,(uint)(local_158.dims == 3)) ^ 3;
            m.h = local_158.h;
            m.cstep = (long)local_158.h * (long)local_158.w;
            m.d = 1;
            bVar32 = top_blob->dims == 3;
            m_1.c = 1;
            if (!bVar32) {
              m_1.c = top_blob->d;
            }
            m_1.w = top_blob->w;
            m_1.h = top_blob->h;
            m_1.dims = bVar32 ^ 3;
            m_1.elemsize = top_blob->elemsize;
            m_1.data = (void *)(top_blob->cstep * lVar21 * m_1.elemsize + (long)top_blob->data);
            m_1.elempack = top_blob->elempack;
            m_1.allocator = top_blob->allocator;
            m_1.refcount = (int *)0x0;
            m_1.cstep = (long)m_1.h * (long)m_1.w;
            m_1.d = 1;
            crop_pack4_sse(&m,&m_1,_hoffset,_woffset);
            lVar21 = lVar21 + 1;
          } while (lVar21 < top_blob->c);
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar2 == (int *)0x0) {
      return iVar20;
    }
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) {
      return iVar20;
    }
    if (local_158.allocator != (Allocator *)0x0) {
      (*(local_158.allocator)->_vptr_Allocator[3])();
      return iVar20;
    }
joined_r0x001d0f79:
    local_158.allocator = (Allocator *)0x0;
    if (local_158.data == (void *)0x0) {
      return iVar20;
    }
    goto LAB_001d0ae7;
  case 3:
    sVar27 = (local_108 >> 2) << ((_outc & 3U) == 0) * '\x02';
    bVar32 = uStack_e4 == _outd;
    bVar3 = uStack_e0 == _outh;
    bVar4 = uStack_e4 == _outw;
    if (bVar32 && (bVar3 && bVar4)) {
      iVar28 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar22 = (long)_outc % (long)iVar28;
      if (((_outc & 3U) == 0) && (_outc / iVar28 == (int)local_d0)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar2 = bottom_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 == (int *)0x0) goto LAB_001d0f8d;
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 != 0) goto LAB_001d0f8d;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x001d07b5;
      }
    }
    local_108 = sVar27;
    if (((_coffset | _outc) & 3U) == 0) {
      local_e8 = CONCAT31(local_e8._1_3_,bVar32 && (bVar3 && bVar4));
      local_158.w = bottom_blob->w;
      local_158.h = bottom_blob->h;
      if (bottom_blob->dims == 3) {
        local_158.elemsize = bottom_blob->elemsize;
        local_158.data =
             (void *)((long)iVar24 * bottom_blob->cstep * local_158.elemsize +
                     (long)bottom_blob->data);
        lVar21 = (long)local_158.h * (long)local_158.w * local_158.elemsize;
        local_158.d = 1;
        local_158.dims = 3;
      }
      else {
        local_158.d = bottom_blob->d;
        local_158.elemsize = bottom_blob->elemsize;
        local_158.data =
             (void *)((long)iVar24 * bottom_blob->cstep * local_158.elemsize +
                     (long)bottom_blob->data);
        lVar21 = (long)local_158.h * (long)local_158.w * (long)local_158.d * local_158.elemsize;
        local_158.dims = 4;
      }
      local_158.allocator = bottom_blob->allocator;
      local_158.elempack = bottom_blob->elempack;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.cstep = (lVar21 + 0xfU & 0xfffffffffffffff0) / local_158.elemsize;
      local_158.c = uVar26;
      if (bVar32 && (bVar3 && bVar4)) {
        Mat::clone(&m,(__fn *)&local_158,(void *)0x0,_outd,local_158.allocator);
        pOVar30 = local_f0;
        sVar27 = local_108;
        Mat::operator=(top_blob,&m);
        Mat::~Mat(&m);
        iVar20 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
        goto LAB_001d0cec;
      }
      else {
LAB_001d0cec:
        iVar20 = _outc + 3;
        if (-1 < _outc) {
          iVar20 = _outc;
        }
        Mat::create(top_blob,_outw,_outh,_outd,iVar20 >> 2,sVar27,4,pOVar30->blob_allocator);
        iVar20 = -100;
        if (top_blob->data != (void *)0x0) {
          uVar22 = (ulong)top_blob->c;
          if (top_blob->cstep * uVar22 != 0) {
            if (0 < top_blob->c) {
              uVar25 = (ulong)(uint)_outd;
              lVar21 = 0;
              do {
                if (0 < (int)uVar25) {
                  lVar31 = 0;
                  do {
                    m.cstep = (long)local_158.h * (long)local_158.w;
                    m.data = (void *)((long)local_158.data +
                                     (long)(_doffset + (int)lVar31) * local_158.elemsize * m.cstep +
                                     local_158.cstep * lVar21 * local_158.elemsize);
                    m.refcount = (int *)0x0;
                    m.elemsize = local_158.elemsize;
                    m.elempack = local_158.elempack;
                    m.allocator = local_158.allocator;
                    m.w = local_158.w;
                    m.dims = 2;
                    m.h = local_158.h;
                    m.d = 1;
                    m.c = 1;
                    m_1.w = top_blob->w;
                    m_1.h = top_blob->h;
                    m_1.elemsize = top_blob->elemsize;
                    m_1.elempack = top_blob->elempack;
                    m_1.allocator = top_blob->allocator;
                    m_1.cstep = (long)m_1.h * (long)m_1.w;
                    m_1.data = (void *)((long)top_blob->data +
                                       lVar31 * m_1.elemsize * m_1.cstep +
                                       top_blob->cstep * lVar21 * m_1.elemsize);
                    m_1.refcount = (int *)0x0;
                    m_1.dims = 2;
                    m_1.d = 1;
                    m_1.c = 1;
                    crop_pack4_sse(&m,&m_1,_hoffset,_woffset);
                    uVar25 = (ulong)_outd;
                    lVar31 = lVar31 + 1;
                  } while (lVar31 < (long)uVar25);
                  uVar22 = (ulong)(uint)top_blob->c;
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 < (int)uVar22);
            }
            iVar20 = 0;
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar2 == (int *)0x0) {
        return iVar20;
      }
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 != 0) {
        return iVar20;
      }
      if (local_158.allocator != (Allocator *)0x0) {
        (*(local_158.allocator)->_vptr_Allocator[3])();
        return iVar20;
      }
      goto joined_r0x001d0f79;
    }
  }
LAB_001d09ec:
  sVar27 = bottom_blob->elemsize;
  iVar24 = bottom_blob->dims;
  uVar26 = bottom_blob->w;
  uVar23 = bottom_blob->h;
  iVar28 = bottom_blob->d;
  local_158.c = bottom_blob->c;
  opt = local_f0;
  local_158.elempack = bottom_blob->elempack;
LAB_001d0a03:
  local_158.data = bottom_blob->data;
  piVar2 = bottom_blob->refcount;
  local_158.refcount._0_4_ = SUB84(piVar2,0);
  local_158.refcount._4_4_ = (undefined4)((ulong)piVar2 >> 0x20);
  local_158.allocator = bottom_blob->allocator;
  local_158.cstep = bottom_blob->cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  local_158.elemsize = sVar27;
  local_158.dims = iVar24;
  local_158.w = uVar26;
  local_158.h = uVar23;
  local_158.d = iVar28;
  if (iVar20 != 1) {
    m.data = *(void **)opt;
    m.elemsize = (size_t)opt->workspace_allocator;
    m.elempack = opt->openmp_blocktime;
    m._28_1_ = opt->use_winograd_convolution;
    m._29_1_ = opt->use_sgemm_convolution;
    m._30_1_ = opt->use_int8_inference;
    m._31_1_ = opt->use_vulkan_compute;
    m.allocator = *(Allocator **)&opt->use_bf16_storage;
    m._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    uVar5 = opt->flush_denormals;
    uVar6 = opt->use_local_pool_allocator;
    uVar8 = opt->use_reserved_1;
    uVar10 = opt->use_reserved_2;
    uVar12 = opt->use_reserved_3;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar7 = CONCAT31(uVar9,uVar6);
    uVar13._0_1_ = opt->use_reserved_4;
    uVar13._1_1_ = opt->use_reserved_5;
    uVar13._2_1_ = opt->use_reserved_6;
    uVar13._3_1_ = opt->use_reserved_7;
    uVar14 = opt->use_reserved_8;
    uVar15 = opt->use_reserved_9;
    uVar17 = opt->use_reserved_10;
    uVar19 = opt->use_reserved_11;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar13._4_4_ = CONCAT31(uVar16,uVar14);
    m.c = (int)uVar13;
    m.refcount = (int *)opt->workspace_allocator;
    m.h = uVar5;
    m.d = uVar7;
    m._60_4_ = uVar13._4_4_;
    convert_packing(bottom_blob,&local_158,1,(Option *)&m);
  }
  iVar20 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),
                         &local_158,top_blob,opt);
  piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
LAB_001d0ae7:
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar20;
}

Assistant:

int Crop_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}